

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O0

wstring * Microsoft::VisualStudio::CppUnitTestFramework::ToString<wchar_t>
                    (wstring *__return_storage_ptr__,CharClass<wchar_t> *cc)

{
  bool bVar1;
  _Setfill<wchar_t> _Var2;
  _Setw _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  undefined8 uVar6;
  wostream *pwVar7;
  reference this;
  Range<wchar_t> *r;
  const_iterator __end1;
  const_iterator __begin1;
  CharClass<wchar_t> *__range3;
  wostringstream local_190 [8];
  wostringstream os;
  CharClass<wchar_t> *cc_local;
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  uVar6 = std::wostream::operator<<(local_190,std::hex);
  _Var2 = std::setfill<wchar_t>(L'0');
  pwVar7 = std::operator<<(uVar6,_Var2._M_c);
  _Var3 = std::setw(8);
  pwVar7 = std::operator<<(pwVar7,_Var3);
  std::wostream::operator<<(pwVar7,std::showbase);
  std::wostream::put((wchar_t)local_190);
  __end1 = Centaurus::CharClass<wchar_t>::begin(cc);
  r = (Range<wchar_t> *)Centaurus::CharClass<wchar_t>::end(cc);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                *)&r);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
           ::operator*(&__end1);
    wVar4 = Centaurus::Range<wchar_t>::start(this);
    wVar5 = Centaurus::Range<wchar_t>::end(this);
    if (wVar4 + L'\x01' == wVar5) {
      wVar4 = Centaurus::Range<wchar_t>::start(this);
      std::wostream::operator<<(local_190,wVar4);
    }
    else {
      wVar4 = Centaurus::Range<wchar_t>::start(this);
      pwVar7 = (wostream *)std::wostream::operator<<(local_190,wVar4);
      pwVar7 = std::operator<<(pwVar7,L'-');
      wVar4 = Centaurus::Range<wchar_t>::end(this);
      std::wostream::operator<<(pwVar7,wVar4 + L'\xffffffff');
    }
    std::operator<<((wostream *)local_190,L' ');
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
    ::operator++(&__end1);
  }
  std::wostream::put((wchar_t)local_190);
  std::__cxx11::wostringstream::str();
  std::__cxx11::wostringstream::~wostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::wstring ToString(const Centaurus::CharClass<TCHAR>& cc)
            {
                std::wostringstream os;
                
                os << std::hex << std::setfill(L'0') << std::setw(sizeof(TCHAR) * 2) << std::showbase;
                os.put(L'[');
                for (const auto& r : cc)
                {
                    if (r.start() + 1 == r.end())
                        os << (unsigned int)r.start();
                    else
                        os << (unsigned int)r.start() << L'-' << (unsigned int)r.end() - 1;
                    os << L' ';
                }
                os.put(L']');

                return os.str();
            }